

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  void *pvVar1;
  undefined4 *puVar2;
  bool bVar3;
  bool bVar4;
  connectdata *conn_00;
  _Bool _Var5;
  CURLcode CVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  CURLcode unaff_EBP;
  _Bool *p_Var10;
  SessionHandle *pSVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  undefined1 connected;
  char *value;
  char *name;
  char *local_60;
  void *local_58;
  char *local_50;
  size_t local_48;
  _Bool *local_40;
  connectdata *local_38;
  
  *done = false;
  pSVar11 = conn->data;
  local_58 = (pSVar11->req).protop;
  pcVar15 = (pSVar11->state).path;
  lVar12 = 1;
  pcVar14 = pcVar15 + -1;
  local_40 = done;
  local_38 = conn;
  do {
    pcVar13 = pcVar14;
    pcVar14 = pcVar13 + 1;
    _Var5 = imap_is_bchar(pcVar13[1]);
    lVar12 = lVar12 + -1;
  } while (_Var5);
  if (lVar12 == 0) {
    *(undefined8 *)((long)local_58 + 8) = 0;
LAB_0049fb53:
    while (*pcVar14 == ';') {
      pcVar15 = pcVar14 + 1;
      sVar9 = 0;
      pcVar14 = pcVar15;
LAB_0049fb6b:
      if (*pcVar14 == '\0') goto LAB_0049fcb9;
      if (*pcVar14 != '=') goto code_r0x0049fb7c;
      CVar6 = Curl_urldecode(pSVar11,pcVar15,sVar9,&local_50,(size_t *)0x0,true);
      if (CVar6 != CURLE_OK) goto LAB_0049fc01;
      pcVar15 = pcVar14 + 1;
      sVar9 = 0xffffffffffffffff;
      do {
        pcVar13 = pcVar14 + 1;
        pcVar14 = pcVar14 + 1;
        _Var5 = imap_is_bchar(*pcVar13);
        sVar9 = sVar9 + 1;
      } while (_Var5);
      CVar6 = Curl_urldecode(pSVar11,pcVar15,sVar9,&local_60,&local_48,true);
      if (CVar6 == CURLE_OK) {
        iVar7 = Curl_raw_equal(local_50,"UIDVALIDITY");
        if ((iVar7 == 0) || (*(long *)((long)local_58 + 0x10) != 0)) {
          iVar7 = Curl_raw_equal(local_50,"UID");
          if ((iVar7 == 0) || (*(long *)((long)local_58 + 0x18) != 0)) {
            iVar7 = Curl_raw_equal(local_50,"SECTION");
            if ((iVar7 == 0) || (*(long *)((long)local_58 + 0x20) != 0)) {
              iVar7 = Curl_raw_equal(local_50,"PARTIAL");
              if ((iVar7 == 0) || (*(long *)((long)local_58 + 0x28) != 0)) {
                (*Curl_cfree)(local_50);
                (*Curl_cfree)(local_60);
LAB_0049fcb9:
                unaff_EBP = CURLE_URL_MALFORMAT;
                bVar3 = false;
                goto LAB_0049fcc1;
              }
              if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
                local_60[local_48 - 1] = '\0';
              }
              *(char **)((long)local_58 + 0x28) = local_60;
            }
            else {
              if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
                local_60[local_48 - 1] = '\0';
              }
              *(char **)((long)local_58 + 0x20) = local_60;
            }
          }
          else {
            if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
              local_60[local_48 - 1] = '\0';
            }
            *(char **)((long)local_58 + 0x18) = local_60;
          }
        }
        else {
          if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
            local_60[local_48 - 1] = '\0';
          }
          *(char **)((long)local_58 + 0x10) = local_60;
        }
        local_60 = (char *)0x0;
        (*Curl_cfree)(local_50);
        (*Curl_cfree)(local_60);
        bVar3 = true;
      }
      else {
        (*Curl_cfree)(local_50);
LAB_0049fc01:
        bVar3 = false;
        unaff_EBP = CVar6;
      }
LAB_0049fcc1:
      if (!bVar3) goto LAB_0049fe26;
    }
    if (((*(long *)((long)local_58 + 8) != 0) && (*pcVar14 == '?')) &&
       (*(long *)((long)local_58 + 0x18) == 0)) {
      pcVar15 = pcVar14 + 1;
      sVar9 = 0xffffffffffffffff;
      do {
        pcVar13 = pcVar14 + 1;
        pcVar14 = pcVar14 + 1;
        _Var5 = imap_is_bchar(*pcVar13);
        sVar9 = sVar9 + 1;
      } while (_Var5);
      unaff_EBP = Curl_urldecode(pSVar11,pcVar15,sVar9,(char **)((long)local_58 + 0x30),
                                 (size_t *)0x0,true);
      if (unaff_EBP != CURLE_OK) goto LAB_0049fe26;
    }
    unaff_EBP = (uint)(*pcVar14 != '\0') * 3;
  }
  else {
    pcVar8 = pcVar14;
    if ((pcVar15 < pcVar14) && (pcVar8 = pcVar13, *pcVar13 != '/')) {
      pcVar8 = pcVar14;
    }
    unaff_EBP = Curl_urldecode(pSVar11,pcVar15,(long)pcVar8 - (long)pcVar15,
                               (char **)((long)local_58 + 8),(size_t *)0x0,true);
    if (unaff_EBP == CURLE_OK) {
      unaff_EBP = CURLE_OK;
      goto LAB_0049fb53;
    }
  }
LAB_0049fe26:
  conn_00 = local_38;
  if (unaff_EBP != CURLE_OK) {
    return unaff_EBP;
  }
  pSVar11 = local_38->data;
  pcVar15 = (pSVar11->set).str[4];
  if (pcVar15 == (char *)0x0) {
LAB_0049fe85:
    CVar6 = CURLE_OK;
  }
  else {
    pvVar1 = (pSVar11->req).protop;
    CVar6 = Curl_urldecode(pSVar11,pcVar15,0,(char **)((long)pvVar1 + 0x38),(size_t *)0x0,true);
    if (CVar6 == CURLE_OK) {
      pcVar15 = *(char **)((long)pvVar1 + 0x38);
      for (pcVar14 = pcVar15; *pcVar14 != '\0'; pcVar14 = pcVar14 + 1) {
        if (*pcVar14 == ' ') {
          pcVar14 = (*Curl_cstrdup)(pcVar14);
          *(char **)((long)pvVar1 + 0x40) = pcVar14;
          *pcVar15 = '\0';
          CVar6 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)pvVar1 + 0x40) != 0) {
            CVar6 = CURLE_OK;
          }
          goto LAB_0049fe87;
        }
        pcVar15 = pcVar15 + 1;
      }
      goto LAB_0049fe85;
    }
  }
LAB_0049fe87:
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  pSVar11 = conn_00->data;
  (pSVar11->req).size = -1;
  Curl_pgrsSetUploadCounter(pSVar11,0);
  Curl_pgrsSetDownloadCounter(pSVar11,0);
  Curl_pgrsSetUploadSize(pSVar11,-1);
  pcVar15 = (char *)0xffffffffffffffff;
  Curl_pgrsSetDownloadSize(pSVar11,-1);
  pSVar11 = conn_00->data;
  puVar2 = (undefined4 *)(pSVar11->req).protop;
  if ((pSVar11->set).opt_no_body == true) {
    *puVar2 = 1;
  }
  *local_40 = false;
  pcVar14 = *(char **)(puVar2 + 2);
  if ((((pcVar14 == (char *)0x0) ||
       (pcVar15 = (conn_00->proto).imapc.mailbox, pcVar15 == (char *)0x0)) ||
      (iVar7 = strcmp(pcVar14,pcVar15), iVar7 != 0)) ||
     (((*(char **)(puVar2 + 4) != (char *)0x0 &&
       (pcVar15 = (conn_00->proto).imapc.mailbox_uidvalidity, pcVar15 != (char *)0x0)) &&
      (iVar7 = strcmp(*(char **)(puVar2 + 4),pcVar15), iVar7 != 0)))) {
    connected = SUB81(pcVar15,0);
    bVar3 = false;
  }
  else {
    connected = SUB81(pcVar15,0);
    bVar3 = true;
  }
  if ((pSVar11->set).upload == true) {
    if (pcVar14 == (char *)0x0) {
      pcVar15 = "Cannot APPEND without a mailbox.";
LAB_004a0007:
      Curl_failf(pSVar11,pcVar15);
      connected = SUB81(pcVar15,0);
      CVar6 = CURLE_URL_MALFORMAT;
      goto LAB_004a0108;
    }
    if ((pSVar11->state).infilesize < 0) {
      connected = 0xc0;
      Curl_failf(pSVar11,"Cannot APPEND with unknown input file size\n");
      CVar6 = CURLE_UPLOAD_FAILED;
      goto LAB_004a0108;
    }
    pcVar15 = imap_atom(pcVar14);
    if (pcVar15 != (char *)0x0) {
      connected = 0xec;
      CVar6 = imap_sendf(conn_00,"APPEND %s (\\Seen) {%ld}",pcVar15,
                         (conn_00->data->state).infilesize);
      (*Curl_cfree)(pcVar15);
      if (CVar6 == CURLE_OK) {
        (conn_00->proto).imapc.state = IMAP_APPEND;
      }
      goto LAB_004a0108;
    }
LAB_004a0103:
    CVar6 = CURLE_OUT_OF_MEMORY;
  }
  else {
    lVar12 = *(long *)(puVar2 + 0xe);
    connected = lVar12 == 0;
    bVar4 = (bool)(pcVar14 == (char *)0x0 | bVar3);
    if (!bVar4 || (bool)connected) {
      connected = lVar12 != 0;
      if (bVar3 && !(bool)connected) {
        if (*(long *)(puVar2 + 6) != 0) {
          CVar6 = imap_perform_fetch(conn_00);
          goto LAB_004a0108;
        }
        if (*(long *)(puVar2 + 0xc) != 0) {
          CVar6 = imap_perform_search(conn_00);
          goto LAB_004a0108;
        }
      }
      if ((!bVar4) &&
         (((lVar12 != 0 || (*(long *)(puVar2 + 6) != 0)) || (*(long *)(puVar2 + 0xc) != 0)))) {
        (*Curl_cfree)((conn_00->proto).imapc.mailbox);
        (conn_00->proto).imapc.mailbox = (char *)0x0;
        (*Curl_cfree)((conn_00->proto).imapc.mailbox_uidvalidity);
        (conn_00->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        if (*(char **)(puVar2 + 2) == (char *)0x0) {
          pSVar11 = conn_00->data;
          pcVar15 = "Cannot SELECT without a mailbox.";
          goto LAB_004a0007;
        }
        pcVar15 = imap_atom(*(char **)(puVar2 + 2));
        if (pcVar15 != (char *)0x0) {
          connected = 0x25;
          CVar6 = imap_sendf(conn_00,"SELECT %s",pcVar15);
          (*Curl_cfree)(pcVar15);
          if (CVar6 == CURLE_OK) {
            (conn_00->proto).imapc.state = IMAP_SELECT;
          }
          goto LAB_004a0108;
        }
        goto LAB_004a0103;
      }
    }
    CVar6 = imap_perform_list(conn_00);
  }
LAB_004a0108:
  if (CVar6 == CURLE_OK) {
    p_Var10 = local_40;
    CVar6 = imap_multi_statemach(conn_00,local_40);
    connected = SUB81(p_Var10,0);
  }
  if ((CVar6 == CURLE_OK) && (CVar6 = CURLE_OK, *local_40 == true)) {
    imap_dophase_done(conn_00,(_Bool)connected);
  }
  return CVar6;
code_r0x0049fb7c:
  pcVar14 = pcVar14 + 1;
  sVar9 = sVar9 + 1;
  goto LAB_0049fb6b;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}